

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int idaLsSetup(IDAMem IDA_mem,N_Vector y,N_Vector yp,N_Vector r,N_Vector vt1,N_Vector vt2,
              N_Vector vt3)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  
  pvVar1 = IDA_mem->ida_lmem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -2;
    IDAProcessError(IDA_mem,-2,0x57a,"idaLsSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Linear solver memory is NULL.");
  }
  else {
    iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x20));
    if (iVar2 == 3) {
      *(undefined4 *)((long)pvVar1 + 0xf8) = 0;
      iVar2 = 0;
    }
    else {
      *(N_Vector *)((long)pvVar1 + 0x48) = y;
      *(N_Vector *)((long)pvVar1 + 0x50) = yp;
      *(N_Vector *)((long)pvVar1 + 0x58) = r;
      *(long *)((long)pvVar1 + 0xe8) = IDA_mem->ida_nst;
      *(sunrealtype *)((long)pvVar1 + 0xf0) = IDA_mem->ida_tn;
      if (*(long *)((long)pvVar1 + 0x28) == 0) {
        uVar3 = 0;
      }
      else {
        *(long *)((long)pvVar1 + 0x80) = *(long *)((long)pvVar1 + 0x80) + 1;
        iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x20));
        if ((iVar2 == 0) && (iVar2 = SUNMatZero(*(undefined8 *)((long)pvVar1 + 0x28)), iVar2 != 0))
        {
          IDAProcessError(IDA_mem,-8,0x59c,"idaLsSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                          ,"The SUNMatZero routine failed in an unrecoverable manner.");
          *(undefined4 *)((long)pvVar1 + 0xf8) = 0xfffffff8;
          return -8;
        }
        iVar2 = (**(code **)((long)pvVar1 + 0x10))
                          (IDA_mem->ida_tn,IDA_mem->ida_cj,y,yp,r,
                           *(undefined8 *)((long)pvVar1 + 0x28),*(undefined8 *)((long)pvVar1 + 0x18)
                           ,vt1,vt2,vt3);
        if (iVar2 < 0) {
          IDAProcessError(IDA_mem,-6,0x5a8,"idaLsSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                          ,"The Jacobian routine failed in an unrecoverable manner.");
          *(undefined4 *)((long)pvVar1 + 0xf8) = 0xfffffffa;
          return -1;
        }
        if (iVar2 != 0) {
          *(undefined4 *)((long)pvVar1 + 0xf8) = 0xfffffff9;
          return 1;
        }
        uVar3 = *(undefined8 *)((long)pvVar1 + 0x28);
      }
      iVar2 = SUNLinSolSetup(*(undefined8 *)((long)pvVar1 + 0x20),uVar3);
      *(int *)((long)pvVar1 + 0xf8) = iVar2;
    }
  }
  return iVar2;
}

Assistant:

int idaLsSetup(IDAMem IDA_mem, N_Vector y, N_Vector yp, N_Vector r,
               N_Vector vt1, N_Vector vt2, N_Vector vt3)
{
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(idals_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    idals_mem->last_flag = IDALS_SUCCESS;
    return (idals_mem->last_flag);
  }

  /* Set IDALs N_Vector pointers to inputs */
  idals_mem->ycur  = y;
  idals_mem->ypcur = yp;
  idals_mem->rcur  = r;

  /* Update values for last jac/pset call */
  idals_mem->nstlj = IDA_mem->ida_nst;
  idals_mem->tnlj  = IDA_mem->ida_tn;

  /* recompute if J if it is non-NULL */
  if (idals_mem->J)
  {
    /* Increment nje counter. */
    idals_mem->nje++;

    /* Clear the linear system matrix if necessary */
    if (SUNLinSolGetType(idals_mem->LS) == SUNLINEARSOLVER_DIRECT)
    {
      retval = SUNMatZero(idals_mem->J);
      if (retval != 0)
      {
        IDAProcessError(IDA_mem, IDALS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_MATZERO_FAILED);
        idals_mem->last_flag = IDALS_SUNMAT_FAIL;
        return (idals_mem->last_flag);
      }
    }

    /* Call Jacobian routine */
    retval = idals_mem->jac(IDA_mem->ida_tn, IDA_mem->ida_cj, y, yp, r,
                            idals_mem->J, idals_mem->J_data, vt1, vt2, vt3);
    if (retval < 0)
    {
      IDAProcessError(IDA_mem, IDALS_JACFUNC_UNRECVR, __LINE__, __func__,
                      __FILE__, MSG_LS_JACFUNC_FAILED);
      idals_mem->last_flag = IDALS_JACFUNC_UNRECVR;
      return (-1);
    }
    if (retval > 0)
    {
      idals_mem->last_flag = IDALS_JACFUNC_RECVR;
      return (1);
    }
  }

  /* Call LS setup routine -- the LS will call idaLsPSetup if applicable */
  idals_mem->last_flag = SUNLinSolSetup(idals_mem->LS, idals_mem->J);
  return (idals_mem->last_flag);
}